

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void __thiscall
DigitalConsumer_python::DigitalConsumer_python
          (DigitalConsumer_python *this,HighFreqDataType *hf,int ringbufsize,
          HFParsingInfo *parseargs)

{
  size_type sVar1;
  allocator_type *__a;
  HFParsingInfo *in_RCX;
  HFParsingInfo *in_RDI;
  HighFreqDataType *in_stack_fffffffffffffed0;
  size_t *this_00;
  value_type_conflict2 *__value;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined2 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff02;
  undefined4 in_stack_ffffffffffffff04;
  HFParsingInfo *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  HighFreqDataType *in_stack_ffffffffffffffc8;
  DigitalConsumer *in_stack_ffffffffffffffd0;
  
  HighFreqDataType::HighFreqDataType
            ((HighFreqDataType *)
             CONCAT44(in_stack_ffffffffffffff04,
                      CONCAT22(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00)),
             (HighFreqDataType *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  HFParsingInfo::HFParsingInfo(in_RCX,in_RDI);
  DigitalConsumer::DigitalConsumer
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8);
  HFParsingInfo::~HFParsingInfo((HFParsingInfo *)in_stack_fffffffffffffed0);
  HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffffed0);
  boost::python::wrapper<DigitalConsumer>::wrapper((wrapper<DigitalConsumer> *)0x39bb66);
  (in_RDI->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__DigitalConsumer_python_005d6920;
  this_00 = &in_RDI[0x11].sizeOf;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&in_RCX->indices);
  __a = (allocator_type *)(sVar1 >> 1);
  __value = (value_type_conflict2 *)&stack0xffffffffffffff01;
  std::allocator<short>::allocator((allocator<short> *)0x39bbae);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)in_RCX,(size_type)in_RDI,__value,__a);
  std::allocator<short>::~allocator((allocator<short> *)0x39bbd3);
  boost::python::api::object::object((object *)this_00);
  return;
}

Assistant:

DigitalConsumer_python(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
        : DigitalConsumer(hf, ringbufsize, parseargs),
          data(parseargs.indices.size()/2, 0){}